

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O1

void __thiscall CardProdDiffInv::test_method(CardProdDiffInv *this)

{
  double *__ptr;
  Index IVar1;
  Index IVar2;
  bool bVar3;
  Index outer_stride;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar5;
  char *pcVar6;
  VectorXd v;
  VectorXd x;
  MatrixXd J;
  MatrixXd Jtest;
  CartesianProduct S;
  CartesianProduct R2SO3;
  SO3<mnf::ExpMapMatrix> RotSpace;
  RealSpace R3;
  RealSpace R2;
  undefined1 local_868 [16];
  Matrix<double,__1,__1,_0,__1,__1> *local_858;
  void *local_850;
  double *local_848;
  long lStack_840;
  shared_count local_838;
  void *local_830;
  undefined8 uStack_828;
  Matrix<double,__1,__1,_0,__1,__1> local_818;
  Scalar local_800;
  Matrix<double,__1,__1,_0,__1,__1> local_7f8;
  char *local_7d8;
  char *local_7d0;
  Scalar local_7c8;
  Scalar local_7c0;
  Scalar local_7b8;
  Scalar local_7b0;
  Matrix<double,__1,__1,_0,__1,__1> *local_7a8;
  void *pvStack_7a0;
  Scalar local_788;
  Scalar local_780;
  Scalar local_778;
  Scalar local_770;
  Scalar local_768;
  Scalar local_760;
  Scalar local_758;
  Scalar local_750;
  Scalar local_748;
  Scalar local_740;
  Scalar local_738;
  Scalar local_730;
  Scalar local_728;
  Scalar local_720;
  Scalar local_718;
  Scalar local_710;
  Scalar local_708;
  Scalar local_700;
  Scalar local_6f8;
  Scalar local_6f0;
  Scalar local_6e8;
  Scalar local_6e0;
  Scalar local_6d8;
  Scalar local_6d0;
  Scalar local_6c8;
  Scalar local_6c0;
  Scalar local_6b8;
  Scalar local_6b0;
  Scalar local_6a8;
  Scalar local_6a0;
  Scalar local_698;
  Scalar local_690;
  Scalar local_688;
  Scalar local_680;
  Scalar local_678;
  Scalar local_670;
  Scalar local_668;
  Scalar local_660;
  Scalar local_658;
  Scalar local_650;
  Scalar local_648;
  Scalar local_640;
  Scalar local_638;
  Scalar local_630;
  Scalar local_628;
  Scalar local_620;
  Scalar local_618;
  Scalar local_610;
  Scalar local_608;
  Scalar local_600;
  Scalar local_5f8;
  Scalar local_5f0;
  Scalar local_5e8;
  Scalar local_5e0;
  Scalar local_5d8;
  Scalar local_5d0;
  Scalar local_5c8;
  Scalar local_5c0;
  Scalar local_5b8;
  Scalar local_5b0;
  Scalar local_5a8;
  Scalar local_5a0;
  Scalar local_598;
  Scalar local_590;
  Scalar local_588;
  Scalar local_580;
  Scalar local_578;
  Scalar local_570;
  Scalar local_568;
  Scalar local_560;
  Scalar local_558;
  Scalar local_550;
  Scalar local_548;
  Scalar local_540;
  Scalar local_538;
  Scalar local_530;
  Scalar local_528;
  Scalar local_520;
  Scalar local_518;
  Scalar local_510;
  Scalar local_508;
  Scalar local_500;
  Scalar local_4f8;
  Scalar local_4f0;
  Scalar local_4e8;
  Scalar local_4e0;
  Scalar local_4d8;
  Scalar local_4d0;
  Scalar local_4c8;
  Scalar local_4c0;
  Scalar local_4b8;
  Scalar local_4b0;
  Scalar local_4a8;
  Scalar local_4a0;
  Scalar local_498;
  Scalar local_490;
  Scalar local_488;
  Scalar local_480;
  Scalar local_478;
  Scalar local_470;
  Scalar local_468;
  Scalar local_460;
  undefined1 local_458 [24];
  char **local_440;
  undefined8 uStack_438;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  code *local_2f8 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_2a0 [24];
  void *local_288;
  void *local_270;
  code *local_258 [11];
  vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
  local_200 [24];
  void *local_1e8;
  void *local_1d0;
  SO3<mnf::ExpMapMatrix> local_1b8;
  code *local_118 [11];
  void *local_c0;
  void *local_b0;
  code *local_a0 [11];
  void *local_48;
  void *local_38;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_a0,2);
  mnf::RealSpace::RealSpace((RealSpace *)local_118,3);
  mnf::SO3<mnf::ExpMapMatrix>::SO3(&local_1b8);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_258,(Manifold *)local_a0,&local_1b8.super_Manifold);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)local_2f8,(Manifold *)local_258,(Manifold *)local_118);
  local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_7f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_7f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_7f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  free((void *)0x0);
  local_7f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       Eigen::internal::conditional_aligned_new_auto<double,true>(0x70);
  local_458._0_8_ = &local_7f8;
  local_7f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 8;
  local_7f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0xe;
  local_458._8_8_ = (void *)0x0;
  local_458._16_8_ = 1;
  local_440 = (char **)0x1;
  *local_7f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = 1.0
  ;
  local_848 = (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_458,
                      (Scalar *)&local_848);
  local_858 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_858);
  local_868._0_8_ = (double *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)local_868);
  local_7d8 = (char *)0x0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,(Scalar *)&local_7d8);
  local_800 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_800);
  local_7b0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_7b0);
  local_7b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_7b8);
  local_7c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_7c0);
  local_7c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_7c8);
  local_460 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_460);
  local_468 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_468);
  local_470 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_470);
  local_478 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_478);
  local_480 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_480);
  local_488 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_488);
  local_490 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_490);
  local_498 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_498);
  local_4a0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4a0);
  local_4a8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4a8);
  local_4b0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4b0);
  local_4b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4b8);
  local_4c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4c0);
  local_4c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4c8);
  local_4d0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4d0);
  local_4d8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4d8);
  local_4e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4e0);
  local_4e8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4e8);
  local_4f0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4f0);
  local_4f8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_4f8);
  local_500 = -0.064043491813865;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_500);
  local_508 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_508);
  local_510 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_510);
  local_518 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_518);
  local_520 = -0.064043491813865;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_520);
  local_528 = 0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_528);
  local_530 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_530);
  local_538 = -0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_538);
  local_540 = -0.064043491813865;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_540);
  local_548 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_548);
  local_550 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_550);
  local_558 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_558);
  local_560 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_560);
  local_568 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_568);
  local_570 = -0.110117993664377;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_570);
  local_578 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_578);
  local_580 = -0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_580);
  local_588 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_588);
  local_590 = -0.110117993664377;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_590);
  local_598 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_598);
  local_5a0 = 0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5a0);
  local_5a8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5a8);
  local_5b0 = -0.110117993664377;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5b0);
  local_5b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5b8);
  local_5c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5c0);
  local_5c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5c8);
  local_5d0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5d0);
  local_5d8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5d8);
  local_5e0 = -0.042109988599266;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5e0);
  local_5e8 = 0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5e8);
  local_5f0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5f0);
  local_5f8 = -0.545030346992499;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_5f8);
  local_600 = -0.042109988599266;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_600);
  local_608 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_608);
  local_610 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_610);
  local_618 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_618);
  local_620 = -0.042109988599266;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_620);
  local_628 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_628);
  local_630 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_630);
  local_638 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_638);
  local_640 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_640);
  local_648 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_648);
  local_650 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_650);
  local_658 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_658);
  local_660 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_660);
  local_668 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_668);
  local_670 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_670);
  local_678 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_678);
  local_680 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_680);
  local_688 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_688);
  local_690 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_690);
  local_698 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_698);
  local_6a0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6a0);
  local_6a8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6a8);
  local_6b0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6b0);
  local_6b8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6b8);
  local_6c0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6c0);
  local_6c8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6c8);
  local_6d0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6d0);
  local_6d8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6d8);
  local_6e0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6e0);
  local_6e8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6e8);
  local_6f0 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6f0);
  local_6f8 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_6f8);
  local_700 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_700);
  local_708 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_708);
  local_710 = 1.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_710);
  local_718 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_718);
  local_720 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_720);
  local_728 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_728);
  local_730 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_730);
  local_738 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_738);
  local_740 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_740);
  local_748 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_748);
  local_750 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_750);
  local_758 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_758);
  local_760 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_760);
  local_768 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_768);
  local_770 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_770);
  local_778 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_778);
  local_780 = 0.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar4,&local_780);
  local_788 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar4,&local_788);
  if ((((long)local_440 + local_458._8_8_ ==
        (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_458._0_8_)->m_storage)
        .m_rows) ||
      ((((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_458._0_8_)->m_storage).
       m_cols == 0)) &&
     (local_458._16_8_ ==
      (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_458._0_8_)->m_storage).
      m_cols)) {
    mnf::Manifold::getZero();
    mnf::SubPoint::value();
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_858,
               (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                *)&local_848);
    mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&local_440);
    free((void *)local_458._8_8_);
    local_868._0_8_ = (double *)0x0;
    local_868._8_8_ = 0;
    free((void *)0x0);
    local_868._0_8_ = Eigen::internal::conditional_aligned_new_auto<double,true>(8);
    local_868._8_8_ = 8;
    local_458._8_8_ = (void *)0x0;
    local_458._16_8_ = 1;
    local_440 = (char **)0x1;
    *(double *)local_868._0_8_ = 243.27432598;
    local_848 = (double *)0xc141a82b9e65bea1;
    local_458._0_8_ = (Matrix<double,__1,__1,_0,__1,__1> *)local_868;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_458,
                        (Scalar *)&local_848);
    local_7d8 = (char *)0x3fd5c8e11a61ab16;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,(Scalar *)&local_7d8);
    local_800 = 0.58526775;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,&local_800);
    local_7b0 = 0.223811;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,&local_7b0);
    local_7b8 = 3.08;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,&local_7b8);
    local_7c0 = 1e-08;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                       (pCVar5,&local_7c0);
    local_7c8 = 232.5;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar5,&local_7c8);
    if (((long)local_440 + local_458._8_8_ ==
         (((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_458._0_8_)->m_storage
         ).m_rows) && (local_458._16_8_ == 1)) {
      local_7a8 = local_858;
      pvStack_7a0 = local_850;
      if ((long)local_850 < 0 && local_858 != (Matrix<double,__1,__1,_0,__1,__1> *)0x0) {
        pcVar6 = 
        "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
        ;
      }
      else {
        local_440 = (char **)0x0;
        uStack_438 = 0;
        local_458._0_8_ = local_858;
        local_458._8_8_ = local_850;
        local_830 = (void *)0x0;
        uStack_828 = 0;
        local_848 = (double *)local_868._0_8_;
        lStack_840 = local_868._8_8_;
        if (-1 < (long)local_868._8_8_ || (double *)local_868._0_8_ == (double *)0x0) {
          mnf::Manifold::retractation(local_2f8,&local_7a8,local_458,&local_848);
          free(local_830);
          free(local_440);
          local_440 = (char **)0x0;
          uStack_438 = 0;
          local_458._0_8_ = local_858;
          local_458._8_8_ = local_850;
          if (-1 < (long)local_850 || local_858 == (Matrix<double,__1,__1,_0,__1,__1> *)0x0) {
            mnf::Manifold::diffPseudoLog0((Ref_conflict *)&local_848);
            IVar2 = local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols;
            IVar1 = local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
            __ptr = local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data;
            local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_data = local_848;
            local_848 = __ptr;
            local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows = lStack_840;
            local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols = (Index)local_838.pi_;
            lStack_840 = IVar1;
            local_838.pi_ = (sp_counted_base *)IVar2;
            free(__ptr);
            free(local_440);
            local_308 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
            ;
            local_300 = "";
            local_318 = &boost::unit_test::basic_cstring<char_const>::null;
            local_310 = &boost::unit_test::basic_cstring<char_const>::null;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_308,0x188);
            local_800 = 1e-12;
            bVar3 = Eigen::internal::
                    isApprox_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
                    ::run(&local_818,&local_7f8,&local_800);
            local_848 = (double *)CONCAT71(local_848._1_7_,bVar3);
            lStack_840 = 0;
            local_838.pi_ = (sp_counted_base *)0x0;
            local_7d8 = "J.isApprox(Jtest)";
            local_7d0 = "";
            local_458._8_8_ = local_458._8_8_ & 0xffffffffffffff00;
            local_458._0_8_ = &PTR__lazy_ostream_00144b88;
            local_458._16_8_ = &boost::unit_test::lazy_ostream::inst;
            local_328 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
            ;
            local_320 = "";
            local_440 = &local_7d8;
            boost::test_tools::tt_detail::report_assertion();
            boost::detail::shared_count::~shared_count(&local_838);
            free((void *)local_868._0_8_);
            free(local_858);
            free(local_7f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            free(local_818.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            local_2f8[0] = free;
            if (local_270 != (void *)0x0) {
              operator_delete(local_270);
            }
            if (local_288 != (void *)0x0) {
              operator_delete(local_288);
            }
            std::
            vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
            ::~vector(local_2a0);
            mnf::Manifold::~Manifold((Manifold *)local_2f8);
            local_258[0] = free;
            if (local_1d0 != (void *)0x0) {
              operator_delete(local_1d0);
            }
            if (local_1e8 != (void *)0x0) {
              operator_delete(local_1e8);
            }
            std::
            vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
            ::~vector(local_200);
            mnf::Manifold::~Manifold((Manifold *)local_258);
            local_1b8._0_8_ = &PTR__SO3_00144670;
            mnf::ReusableTemporaryMap::~ReusableTemporaryMap
                      ((ReusableTemporaryMap *)((long)&local_1b8 + 0x58));
            mnf::Manifold::~Manifold(&local_1b8.super_Manifold);
            local_118[0] = std::terminate;
            free(local_b0);
            free(local_c0);
            mnf::Manifold::~Manifold((Manifold *)local_118);
            local_a0[0] = std::terminate;
            free(local_38);
            free(local_48);
            mnf::Manifold::~Manifold((Manifold *)local_a0);
            return;
          }
        }
        uStack_438 = 0;
        local_440 = (char **)0x0;
        pcVar6 = 
        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
        ;
        local_458._0_8_ = local_858;
      }
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar6);
    }
    pcVar6 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    pcVar6 = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar6);
}

Assistant:

BOOST_AUTO_TEST_CASE(CardProdDiffInv)
{
  RealSpace R2(2);
  RealSpace R3(3);
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct R2SO3(R2, RotSpace);
  CartesianProduct S(R2SO3, R3);
  Eigen::MatrixXd J;
  Eigen::MatrixXd Jtest(8, 14);
  Jtest << 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0,
      0, 0, 0, 0, 0, 0, 0, -0.064043491813865, 0, 0, 0, -0.064043491813865,
      0.545030346992499, 0, -0.545030346992499, -0.064043491813865, 0, 0, 0, 0,
      0, -0.110117993664377, 0, -0.545030346992499, 0, -0.110117993664377, 0,
      0.545030346992499, 0, -0.110117993664377, 0, 0, 0, 0, 0,
      -0.042109988599266, 0.545030346992499, 0, -0.545030346992499,
      -0.042109988599266, 0, 0, 0, -0.042109988599266, 0, 0, 0, 0, 0, 0, 0, 0,
      0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 0,
      0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 1;
  Eigen::VectorXd x = S.getZero().value();
  Eigen::VectorXd v(8);
  v << 243.27432598, -2314327.23748, 0.3403857, 0.58526775, 0.223811, 3.08,
      0.00000001, 232.5;
  S.retractation(x, x, v);
  J = S.diffPseudoLog0(x);
  BOOST_CHECK(J.isApprox(Jtest));
}